

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# secretbox.h
# Opt level: O3

void hydro_secretbox_setup
               (uint8_t *buf,uint64_t msg_id,char *ctx,uint8_t *key,uint8_t *iv,uint8_t key_tag)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  uchar *dst;
  uchar *src;
  uchar *src_1;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  
  buf[0x28] = '\0';
  buf[0x29] = '\0';
  buf[0x2a] = '\0';
  buf[0x2b] = '\0';
  buf[0x2c] = '\0';
  buf[0x2d] = '\0';
  buf[0x2e] = '\0';
  buf[0x2f] = '\0';
  buf[8] = '\0';
  buf[9] = '\0';
  buf[10] = '\0';
  buf[0xb] = '\0';
  buf[0xc] = '\0';
  buf[0xd] = '\0';
  buf[0xe] = '\0';
  buf[0xf] = '\0';
  buf[0x10] = '\0';
  buf[0x11] = '\0';
  buf[0x12] = '\0';
  buf[0x13] = '\0';
  buf[0x14] = '\0';
  buf[0x15] = '\0';
  buf[0x16] = '\0';
  buf[0x17] = '\0';
  buf[0x18] = '\0';
  buf[0x19] = '\0';
  buf[0x1a] = '\0';
  buf[0x1b] = '\0';
  buf[0x1c] = '\0';
  buf[0x1d] = '\0';
  buf[0x1e] = '\0';
  buf[0x1f] = '\0';
  buf[0x20] = '\0';
  buf[0x21] = '\0';
  buf[0x22] = '\0';
  buf[0x23] = '\0';
  buf[0x24] = '\0';
  buf[0x25] = '\0';
  buf[0x26] = '\0';
  buf[0x27] = '\0';
  buf[0] = '\x06';
  buf[1] = 's';
  buf[2] = 'b';
  buf[3] = 'x';
  buf[4] = '2';
  buf[5] = '5';
  buf[6] = '6';
  buf[7] = '\b';
  *(undefined8 *)(buf + 8) = *(undefined8 *)ctx;
  gimli_core_u8(buf,'\x01');
  uVar1 = *(uint *)(key + 4);
  uVar2 = *(uint *)(key + 8);
  uVar3 = *(uint *)(key + 0xc);
  *(uint *)buf = *(uint *)buf ^ *(uint *)key;
  *(uint *)(buf + 4) = *(uint *)(buf + 4) ^ uVar1;
  *(uint *)(buf + 8) = *(uint *)(buf + 8) ^ uVar2;
  *(uint *)(buf + 0xc) = *(uint *)(buf + 0xc) ^ uVar3;
  gimli_core_u8(buf,key_tag);
  uVar1 = *(uint *)(key + 0x14);
  uVar2 = *(uint *)(key + 0x18);
  uVar3 = *(uint *)(key + 0x1c);
  *(uint *)buf = *(uint *)buf ^ *(uint *)(key + 0x10);
  *(uint *)(buf + 4) = *(uint *)(buf + 4) ^ uVar1;
  *(uint *)(buf + 8) = *(uint *)(buf + 8) ^ uVar2;
  *(uint *)(buf + 0xc) = *(uint *)(buf + 0xc) ^ uVar3;
  gimli_core_u8(buf,key_tag);
  *buf = *buf ^ 0x14;
  auVar4 = vmovdqu8_avx512vl(*(undefined1 (*) [16])iv);
  auVar5 = vmovdqu8_avx512vl(*(undefined1 (*) [16])(buf + 1));
  auVar6[0xf] = 0;
  auVar6._0_15_ = auVar5._0_15_ ^ auVar4._0_15_;
  auVar6 = vmovdqu8_avx512vl(auVar6);
  *(undefined1 (*) [16])(buf + 1) = auVar6;
  gimli_core_u8(buf,'\x01');
  auVar6 = vmovdqu8_avx512vl(*(undefined1 (*) [16])(iv + 0xf));
  auVar4 = vmovdqu8_avx512vl(*(undefined1 (*) [16])buf);
  auVar6 = vmovdqu8_avx512vl(ZEXT516(auVar4._0_5_ ^ auVar6._0_5_));
  *(undefined1 (*) [16])buf = auVar6;
  *(ulong *)(buf + 4) = *(ulong *)(buf + 4) ^ msg_id;
  gimli_core_u8(buf,'\x01');
  return;
}

Assistant:

static void
hydro_secretbox_setup(uint8_t buf[gimli_BLOCKBYTES], uint64_t msg_id,
                      const char    ctx[hydro_secretbox_CONTEXTBYTES],
                      const uint8_t key[hydro_secretbox_KEYBYTES],
                      const uint8_t iv[hydro_secretbox_IVBYTES], uint8_t key_tag)
{
    static const uint8_t prefix[] = { 6, 's', 'b', 'x', '2', '5', '6', 8 };
    uint8_t              msg_id_le[8];

    mem_zero(buf, gimli_BLOCKBYTES);
    COMPILER_ASSERT(hydro_secretbox_CONTEXTBYTES == 8);
    COMPILER_ASSERT(sizeof prefix + hydro_secretbox_CONTEXTBYTES <= gimli_RATE);
    memcpy(buf, prefix, sizeof prefix);
    memcpy(buf + sizeof prefix, ctx, hydro_secretbox_CONTEXTBYTES);
    COMPILER_ASSERT(sizeof prefix + hydro_secretbox_CONTEXTBYTES == gimli_RATE);
    gimli_core_u8(buf, gimli_TAG_HEADER);

    COMPILER_ASSERT(hydro_secretbox_KEYBYTES == 2 * gimli_RATE);
    mem_xor(buf, key, gimli_RATE);
    gimli_core_u8(buf, key_tag);
    mem_xor(buf, key + gimli_RATE, gimli_RATE);
    gimli_core_u8(buf, key_tag);

    COMPILER_ASSERT(hydro_secretbox_IVBYTES < gimli_RATE * 2);
    buf[0] ^= hydro_secretbox_IVBYTES;
    mem_xor(&buf[1], iv, gimli_RATE - 1);
    gimli_core_u8(buf, gimli_TAG_HEADER);
    mem_xor(buf, iv + gimli_RATE - 1, hydro_secretbox_IVBYTES - (gimli_RATE - 1));
    STORE64_LE(msg_id_le, msg_id);
    COMPILER_ASSERT(hydro_secretbox_IVBYTES - gimli_RATE + 8 <= gimli_RATE);
    mem_xor(buf + hydro_secretbox_IVBYTES - gimli_RATE, msg_id_le, 8);
    gimli_core_u8(buf, gimli_TAG_HEADER);
}